

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O3

void copy_suite::back_inserter_copy_n(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  ulong uVar2;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> input;
  int array [4];
  allocator_type local_89;
  vector<int,_std::allocator<int>_> local_88;
  circular_view<int,_18446744073709551615UL> local_70;
  vector<int,_std::allocator<int>_> local_50;
  view_pointer local_38;
  size_type sStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  type local_18 [4];
  
  local_70.member.data = local_18;
  local_18[0] = 0;
  local_18[1] = 0;
  local_18[2] = 0;
  local_18[3] = 0;
  local_70.member.cap = 4;
  local_70.member.size = 0;
  local_70.member.next = 4;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0xde0000006f;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x1bc0000014d;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x22b;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_88;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__l,(allocator_type *)&local_28);
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<int*,std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>>
              (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_70);
  }
  local_28 = 0x14d000000de;
  uStack_20 = 0x22b000001bc;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_88,__l_00,&local_89);
  uVar1 = local_70.member.cap * 2;
  if ((uVar1 & local_70.member.cap * 2 - 1) == 0) {
    uVar2 = local_70.member.next - local_70.member.size & uVar1 - 1;
    sStack_30 = uVar1 - 1 & local_70.member.next;
  }
  else {
    uVar2 = (local_70.member.next - local_70.member.size) % uVar1;
    sStack_30 = local_70.member.next % uVar1;
  }
  local_38 = &local_70;
  first_end.current = sStack_30;
  first_end.parent = local_38;
  first_begin.current = uVar2;
  first_begin.parent = local_38;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x77,"void copy_suite::back_inserter_copy_n()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void back_inserter_copy_n()
{
    int array[4] = {};
    circular_view<int> span(array);
    std::vector<int> input = { 111, 222, 333, 444, 555 };
    std::copy_n(input.begin(), input.size(), std::back_inserter(span));
    {
        std::vector<int> expect = { 222, 333, 444, 555 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}